

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O2

void __thiscall
cereal::InputArchive<cereal::JSONInputArchive,0u>::process<eos::fitting::ModelContour&>
          (InputArchive<cereal::JSONInputArchive,0u> *this,ModelContour *head)

{
  long *plVar1;
  long lVar2;
  
  JSONInputArchive::startNode(*(JSONInputArchive **)(this + 0x20));
  InputArchive<cereal::JSONInputArchive,_0U>::
  processImpl<eos::fitting::ModelContour,_(cereal::traits::detail::sfinae)0>
            (*(InputArchive<cereal::JSONInputArchive,_0U> **)(this + 0x20),head);
  lVar2 = *(long *)(*(long *)(this + 0x20) + 0x160);
  *(long *)(*(long *)(this + 0x20) + 0x160) = lVar2 + -0x30;
  plVar1 = (long *)(lVar2 + -0x48);
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

inline
      void process( T && head )
      {
        prologue( *self, head );
        self->processImpl( head );
        epilogue( *self, head );
      }